

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O1

int funchook_page_alloc(funchook_t *funchook,funchook_page_t **page_out,uint8_t *func,
                       ip_displacement_t *disp)

{
  byte bVar1;
  void *__addr;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  funchook_page_t *pfVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  byte *__s;
  int iVar12;
  uint8_t *puVar13;
  int iVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  bool bVar18;
  int local_106c;
  void *addrs [2];
  char buf [64];
  
  iVar14 = 0;
  do {
    __stream = fopen("/proc/self/maps","r");
    puVar13 = (uint8_t *)0x0;
    if (__stream == (FILE *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = strerror_r(*piVar2,buf,0x40);
      funchook_set_error_message(funchook,"Failed to open /proc/self/maps (%s)",pcVar3);
      iVar12 = -1;
    }
    else {
      addrs[0] = (void *)0x0;
      addrs[1] = (void *)0x0;
      puVar15 = (uint8_t *)0x0;
      puVar17 = (uint8_t *)0x0;
      do {
        do {
          puVar16 = puVar17;
          __s = (byte *)buf;
          uVar10 = 0;
          pcVar3 = fgets((char *)__s,0x1000,__stream);
          puVar17 = puVar16;
          if (pcVar3 == (char *)0x0) {
LAB_00102191:
            bVar18 = false;
          }
          else {
            pbVar5 = (byte *)buf;
            puVar7 = (uint8_t *)0x0;
            do {
              pbVar5 = pbVar5 + 1;
              bVar1 = pbVar5[-1];
              uVar11 = (ulong)bVar1;
              if ((byte)(bVar1 - 0x30) < 10) {
                puVar7 = (uint8_t *)((long)puVar7 << 4 | (ulong)((int)(char)bVar1 - 0x30));
LAB_00102123:
                bVar18 = true;
                uVar11 = uVar10;
              }
              else {
                if ((byte)(bVar1 + 0x9f) < 6) {
                  puVar7 = (uint8_t *)((long)puVar7 * 0x10 + (ulong)((int)(char)bVar1 - 0x57));
                  goto LAB_00102123;
                }
                bVar18 = false;
                __s = pbVar5;
                puVar13 = puVar7;
              }
              uVar10 = uVar11;
            } while (bVar18);
            if ((char)uVar11 != '-') goto LAB_00102191;
            puVar6 = (uint8_t *)0x0;
            do {
              bVar1 = *__s;
              puVar8 = (uint8_t *)(ulong)bVar1;
              if ((byte)(bVar1 - 0x30) < 10) {
                puVar6 = (uint8_t *)((long)puVar6 << 4 | (ulong)((int)(char)bVar1 - 0x30));
LAB_00102175:
                bVar18 = true;
                puVar8 = puVar7;
              }
              else {
                if ((byte)(bVar1 + 0x9f) < 6) {
                  puVar6 = (uint8_t *)((long)puVar6 * 0x10 + (ulong)((int)(char)bVar1 - 0x57));
                  goto LAB_00102175;
                }
                bVar18 = false;
                puVar17 = puVar6;
              }
              __s = __s + 1;
              puVar7 = puVar8;
            } while (bVar18);
            bVar18 = (char)puVar8 == ' ';
          }
          if (!bVar18) {
            if (func < puVar16) {
              if ((ulong)((long)puVar16 - (long)func) < 0x7fffffff) {
                addrs[1] = puVar16;
              }
              iVar12 = 0;
              funchook_log(funchook,"  -- Use address %p or %p for function %p\n",addrs[0],addrs[1],
                           func);
              fclose(__stream);
            }
            else {
              fclose(__stream);
              funchook_set_error_message(funchook,"Could not find a free region near %p",func);
              iVar12 = 8;
            }
            goto LAB_001022df;
          }
          funchook_log(funchook,
                       "  process map: %016lx-%016lx, prev_end=%lx,addr={%lx,%lx},psz=%lx\n",puVar13
                       ,puVar17,puVar16,puVar15,0,0x1000);
        } while (puVar13 < puVar16 + 0x1000);
        if ((puVar13 < func) &&
           (puVar7 = puVar13 + -0x1000, (ulong)((long)func - (long)puVar7) < 0x7fffffff)) {
          puVar15 = puVar7;
          addrs[0] = puVar7;
        }
      } while (puVar16 <= func);
      if ((ulong)((long)puVar16 - (long)func) < 0x7fffffff) {
        addrs[1] = puVar16;
      }
      iVar12 = 0;
      funchook_log(funchook,"  -- Use address %p or %p for function %p\n",addrs[0],addrs[1],func);
      fclose(__stream);
    }
LAB_001022df:
    if (iVar12 == 0) {
      lVar9 = 1;
      do {
        __addr = addrs[lVar9];
        if (__addr != (void *)0x0) {
          pfVar4 = (funchook_page_t *)mmap(__addr,0x1000,3,0x22,-1,0);
          *page_out = pfVar4;
          if (((ulong)((long)func - (long)pfVar4) < 0x7fffefff) ||
             ((ulong)((long)pfVar4 - (long)func) < 0x7fffefff)) {
            local_106c = 0;
            funchook_log(funchook,"  allocate page %p (size=%lu)\n",pfVar4,0x1000);
            bVar18 = false;
            goto LAB_001023f0;
          }
          if (pfVar4 == (funchook_page_t *)0xffffffffffffffff) {
            piVar2 = __errno_location();
            pcVar3 = strerror_r(*piVar2,buf,0x80);
            bVar18 = false;
            funchook_set_error_message(funchook,"mmap failed(addr=%p): %s",__addr,pcVar3);
            local_106c = 8;
            goto LAB_001023f0;
          }
          funchook_log(funchook,"  try to allocate %p but %p (size=%lu)\n",__addr,pfVar4,0x1000);
          munmap(*page_out,0x1000);
        }
        bVar18 = lVar9 != 0;
        lVar9 = lVar9 + -1;
      } while (bVar18);
      bVar18 = true;
    }
    else {
      bVar18 = false;
      local_106c = iVar12;
    }
LAB_001023f0:
    if (!bVar18) {
      return local_106c;
    }
    iVar14 = iVar14 + 1;
    if (iVar14 == 3) {
      funchook_set_error_message(funchook,"Failed to allocate memory in unused regions");
      return 8;
    }
  } while( true );
}

Assistant:

int funchook_page_alloc(funchook_t *funchook, funchook_page_t **page_out, uint8_t *func, ip_displacement_t *disp)
{
#if defined(CPU_64BIT)
    int loop_cnt;

    /* Loop three times just to avoid rare cases such as
     * unused memory region is used between 'get_free_address()'
     * and 'mmap()'.
     */
    for (loop_cnt = 0; loop_cnt < 3; loop_cnt++) {
        void *addrs[2];
        int rv = get_free_address(funchook, func, addrs);
        int i;

        if (rv != 0) {
            return rv;
        }
        for (i = 1; i >= 0; i--) {
            /* Try to use addr[1] (unused memory region after `func`)
             * and then addr[0] (before `func`)
             */
            if (addrs[i] == NULL) {
                continue;
            }
            *page_out = mmap(addrs[i], page_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
            if (SAFE_JUMP_DISTANCE(func, *page_out) ||
                    SAFE_JUMP_DISTANCE(*page_out, func)) {
                funchook_log(funchook, "  allocate page %p (size=%"PRIuPTR")\n", *page_out, page_size);
                return 0;
            }
            if (*page_out == MAP_FAILED) {
                char errbuf[128];

                funchook_set_error_message(funchook, "mmap failed(addr=%p): %s", addrs[i],
                                           funchook_strerror(errno, errbuf, sizeof(errbuf)));
                return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
            }
            funchook_log(funchook, "  try to allocate %p but %p (size=%"PRIuPTR")\n", addrs[i], *page_out, page_size);
            munmap(*page_out, page_size);
        }
    }
    funchook_set_error_message(funchook, "Failed to allocate memory in unused regions");
    return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
#else
    char errbuf[128];

    *page_out = mmap(NULL, page_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
    if (*page_out != MAP_FAILED) {
        funchook_log(funchook, "  allocate page %p (size=%"PRIuPTR")\n", *page_out, page_size);
        return 0;
    }
    funchook_set_error_message(funchook, "mmap failed: %s", funchook_strerror(errno, errbuf, sizeof(errbuf)));
    return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
#endif
}